

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

int Acb_NtkComputeLevelD(Acb_Ntk_t *p,Vec_Int_t *vTfo)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if ((p->vLevelD).nSize < 1) {
    Vec_IntFill(&p->vLevelD,(p->vObjType).nCap,0);
  }
  iVar3 = vTfo->nSize;
  while (0 < iVar3) {
    iVar3 = iVar3 + -1;
    iVar1 = Vec_IntEntry(vTfo,iVar3);
    Acb_ObjComputeLevelD(p,iVar1);
  }
  iVar3 = 0;
  for (iVar1 = 0; iVar1 < (p->vCos).nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(&p->vCos,iVar1);
    iVar2 = Acb_ObjLevelD(p,iVar2);
    if (iVar3 <= iVar2) {
      iVar3 = iVar2;
    }
  }
  p->LevelMax = iVar3;
  return iVar3;
}

Assistant:

int Acb_NtkComputeLevelD( Acb_Ntk_t * p, Vec_Int_t * vTfo )
{
    // it is assumed that vTfo contains CO nodes and level of new nodes was already updated
    int i, iObj, Level = 0;
    if ( !Acb_NtkHasObjLevelD( p ) )
        Acb_NtkCleanObjLevelD( p );
    Vec_IntForEachEntryReverse( vTfo, iObj, i )
        Acb_ObjComputeLevelD( p, iObj );
    Acb_NtkForEachCo( p, iObj, i )
        Level = Abc_MaxInt( Level, Acb_ObjLevelD(p, iObj) );
    p->LevelMax = Level;
    return Level;
}